

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O2

bool __thiscall ON_BrepLoop::IsValid(ON_BrepLoop *this,ON_TextLog *text_log)

{
  int loop_index;
  TYPE TVar1;
  bool bVar2;
  char *pcVar3;
  
  loop_index = this->m_loop_index;
  if (loop_index < 0) {
    BadLoopMessage(loop_index,text_log);
    if (text_log == (ON_TextLog *)0x0) goto LAB_00410825;
    pcVar3 = "loop.m_loop_index < 0.\n";
  }
  else {
    if (0 < (this->m_ti).m_count) {
      TVar1 = this->m_type;
      if (TVar1 < (type_count|outer)) {
        if (-1 < this->m_fi) {
          if (this->m_brep != (ON_Brep *)0x0) {
            return true;
          }
          BadLoopMessage(loop_index,text_log);
          if (text_log == (ON_TextLog *)0x0) goto LAB_00410825;
          pcVar3 = "loop.m_brep is nullptr.\n";
          goto LAB_004107e2;
        }
        BadLoopMessage(loop_index,text_log);
        if (text_log == (ON_TextLog *)0x0) goto LAB_00410825;
        TVar1 = this->m_fi;
        pcVar3 = "loop.m_fi = %d (should be >= 0 ).\n";
      }
      else {
        BadLoopMessage(loop_index,text_log);
        if (text_log == (ON_TextLog *)0x0) goto LAB_00410825;
        pcVar3 = "loop.m_type = %d is not a valid value.\n";
      }
      ON_TextLog::Print(text_log,pcVar3,(ulong)TVar1);
      goto LAB_00410825;
    }
    BadLoopMessage(loop_index,text_log);
    if (text_log == (ON_TextLog *)0x0) goto LAB_00410825;
    pcVar3 = "loop.m_ti[] is empty.\n";
  }
LAB_004107e2:
  ON_TextLog::Print(text_log,pcVar3);
LAB_00410825:
  bVar2 = ON_IsNotValid();
  return bVar2;
}

Assistant:

bool ON_BrepLoop::IsValid( ON_TextLog* text_log ) const
{
  if ( m_loop_index < 0 )
  {
    BadLoopMessage(m_loop_index,text_log);
    if ( text_log )
      text_log->Print("loop.m_loop_index < 0.\n");
    return ON_BrepIsNotValid();
  }

  if ( m_ti.Count() < 1 )
  {
    BadLoopMessage(m_loop_index,text_log);
    if ( text_log )
      text_log->Print("loop.m_ti[] is empty.\n");
    return ON_BrepIsNotValid();
  }
  int i = m_type;
  if ( i < 0 || i > type_count )
  {
    BadLoopMessage(m_loop_index,text_log);
    if ( text_log )
      text_log->Print("loop.m_type = %d is not a valid value.\n",i);
    return ON_BrepIsNotValid();
  }
  if ( m_fi < 0 )
  {
    BadLoopMessage(m_loop_index,text_log);
    if ( text_log )
      text_log->Print("loop.m_fi = %d (should be >= 0 ).\n",m_fi);
    return ON_BrepIsNotValid();
  }
  if ( !m_brep )
  {
    BadLoopMessage(m_loop_index,text_log);
    if ( text_log )
      text_log->Print("loop.m_brep is nullptr.\n");
    return ON_BrepIsNotValid();
  }
  return true;
}